

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono.h
# Opt level: O2

ssize_t __thiscall
fmt::v5::internal::
chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
::write(chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
        *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  undefined8 in_RAX;
  back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_> bVar2;
  int __n_00;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  iVar1 = count_digits(__fd);
  bVar2.container = (this->out).container;
  __n_00 = (int)__buf - iVar1;
  if (__n_00 != 0 && iVar1 <= (int)__buf) {
    uStack_28 = CONCAT17(0x30,(undefined7)uStack_28);
    bVar2.container =
         (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
         std::
         __fill_n_a1<std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,500ul,std::allocator<char>>>,int,char>
                   (bVar2,__n_00,(char *)((long)&uStack_28 + 7));
    (this->out).container = bVar2.container;
  }
  bVar2 = format_decimal<char,unsigned_int,std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,500ul,std::allocator<char>>>,fmt::v5::internal::no_thousands_sep>
                    (bVar2.container,__fd,iVar1);
  (this->out).container = bVar2.container;
  return (ssize_t)bVar2.container;
}

Assistant:

void write(int value, int width) {
    typedef typename int_traits<int>::main_type main_type;
    main_type n = to_unsigned(value);
    int num_digits = internal::count_digits(n);
    if (width > num_digits)
      out = std::fill_n(out, width - num_digits, '0');
    out = format_decimal<char_type>(out, n, num_digits);
  }